

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O1

UniValue * __thiscall
DescribeAddressVisitor::operator()
          (UniValue *__return_storage_ptr__,DescribeAddressVisitor *this,PKHash *keyID)

{
  string key;
  string key_00;
  UniValue val;
  UniValue val_00;
  long in_FS_OFFSET;
  undefined7 in_stack_fffffffffffffec8;
  bool bVar1;
  undefined8 in_stack_fffffffffffffed0;
  _Alloc_hider in_stack_fffffffffffffed8;
  size_type in_stack_fffffffffffffee0;
  undefined8 in_stack_fffffffffffffee8;
  undefined1 auVar2 [32];
  undefined1 in_stack_fffffffffffffef0 [56];
  undefined8 in_stack_ffffffffffffff28;
  undefined1 *puVar3;
  undefined8 in_stack_ffffffffffffff30;
  pointer in_stack_ffffffffffffff38;
  UniValue local_b8;
  long *local_60 [2];
  long local_50 [2];
  undefined1 *local_40;
  undefined8 local_38;
  undefined1 local_30;
  undefined8 local_2f;
  undefined4 local_27;
  undefined2 local_23;
  char local_21;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_40 = &local_30;
  __return_storage_ptr__->typ = VOBJ;
  (__return_storage_ptr__->val)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->val).field_2;
  (__return_storage_ptr__->val).field_2._M_local_buf[0] = '\0';
  *(undefined8 *)((long)&(__return_storage_ptr__->val).field_2 + 1) = local_2f;
  *(undefined4 *)((long)&(__return_storage_ptr__->val).field_2 + 9) = local_27;
  *(undefined2 *)((long)&(__return_storage_ptr__->val).field_2 + 0xd) = local_23;
  (__return_storage_ptr__->val).field_2._M_local_buf[0xf] = local_21;
  (__return_storage_ptr__->val)._M_string_length = 0;
  local_38 = 0;
  local_30 = 0;
  (__return_storage_ptr__->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->keys).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->keys).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->keys).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_60[0] = local_50;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_60,"isscript","");
  bVar1 = false;
  ::UniValue::UniValue<bool,_bool,_true>(&local_b8,(bool *)&stack0xfffffffffffffecf);
  key._M_dataplus._M_p._7_1_ = bVar1;
  key._M_dataplus._M_p._0_7_ = in_stack_fffffffffffffec8;
  key._M_string_length = in_stack_fffffffffffffed0;
  key.field_2._M_allocated_capacity = (size_type)in_stack_fffffffffffffed8._M_p;
  key.field_2._8_8_ = in_stack_fffffffffffffee0;
  auVar2 = in_stack_fffffffffffffef0._0_32_;
  val.val._M_dataplus._M_p = (pointer)auVar2._0_8_;
  val.val._M_string_length = auVar2._8_8_;
  val.val.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )auVar2._16_16_;
  val.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data =
       (_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )(_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )in_stack_fffffffffffffef0._32_24_;
  val._0_8_ = in_stack_fffffffffffffee8;
  val.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffff28;
  val.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffff30;
  val.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffff38;
  ::UniValue::pushKV(__return_storage_ptr__,key,val);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_b8.values);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_b8.keys);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8.val._M_dataplus._M_p != &local_b8.val.field_2) {
    operator_delete(local_b8.val._M_dataplus._M_p,local_b8.val.field_2._M_allocated_capacity + 1);
  }
  if (local_60[0] != local_50) {
    operator_delete(local_60[0],local_50[0] + 1);
  }
  puVar3 = &stack0xffffffffffffff38;
  std::__cxx11::string::_M_construct<char_const*>((string *)&stack0xffffffffffffff28,"iswitness","")
  ;
  bVar1 = false;
  ::UniValue::UniValue<bool,_bool,_true>
            ((UniValue *)&stack0xfffffffffffffed0,(bool *)&stack0xfffffffffffffecf);
  key_00._M_dataplus._M_p._7_1_ = bVar1;
  key_00._M_dataplus._M_p._0_7_ = in_stack_fffffffffffffec8;
  key_00._M_string_length = in_stack_fffffffffffffed0;
  key_00.field_2._M_allocated_capacity = (size_type)in_stack_fffffffffffffed8._M_p;
  key_00.field_2._8_8_ = in_stack_fffffffffffffee0;
  auVar2 = in_stack_fffffffffffffef0._0_32_;
  val_00.val._M_dataplus._M_p = (pointer)auVar2._0_8_;
  val_00.val._M_string_length = auVar2._8_8_;
  val_00.val.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )auVar2._16_16_;
  val_00.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data =
       (_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )(_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )in_stack_fffffffffffffef0._32_24_;
  val_00._0_8_ = in_stack_fffffffffffffee8;
  val_00.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)puVar3;
  val_00.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)in_stack_ffffffffffffff30;
  val_00.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = in_stack_ffffffffffffff38;
  ::UniValue::pushKV(__return_storage_ptr__,key_00,val_00);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector
            ((vector<UniValue,_std::allocator<UniValue>_> *)&stack0xffffffffffffff10);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&stack0xfffffffffffffef8);
  if (in_stack_fffffffffffffed8._M_p != &stack0xfffffffffffffee8) {
    operator_delete(in_stack_fffffffffffffed8._M_p,in_stack_fffffffffffffee8 + 1);
  }
  if (puVar3 != &stack0xffffffffffffff38) {
    operator_delete(puVar3,(ulong)((long)&in_stack_ffffffffffffff38->typ + 1));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

UniValue operator()(const PKHash& keyID) const
    {
        UniValue obj(UniValue::VOBJ);
        obj.pushKV("isscript", false);
        obj.pushKV("iswitness", false);
        return obj;
    }